

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O1

void Cec_ManPatComputePattern1_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vPat)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  while( true ) {
    pGVar3 = pObj;
    pGVar1 = p->pObjs;
    if ((pGVar3 < pGVar1) || (pGVar1 + p->nObjs <= pGVar3)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar4 = (int)((long)pGVar3 - (long)pGVar1 >> 2) * -0x55555555;
    if (p->nTravIdsAlloc <= iVar4) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x23c,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (p->pTravIds[iVar4] == p->nTravIds) break;
    p->pTravIds[iVar4] = p->nTravIds;
    uVar2 = *(ulong *)pGVar3;
    uVar6 = (uint)uVar2;
    if ((~uVar6 & 0x9fffffff) == 0) {
      Vec_IntPush(vPat,(uint)(uVar2 >> 0x1f) & 0x3ffffffe |
                       (uint)((uVar2 & 0x4000000000000000) == 0));
      return;
    }
    if (((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecPat.c"
                    ,0xb4,
                    "void Cec_ManPatComputePattern1_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    pObj = pGVar3 + -(ulong)(uVar6 & 0x1fffffff);
    if ((uVar2 & 0x4000000000000000) == 0) {
      uVar6 = (uint)(uVar2 >> 0x1d) & 7 ^ (uint)((ulong)*(undefined8 *)pObj >> 0x3e);
      if ((uVar6 & 1) != 0) {
        uVar5 = (uint)(uVar2 >> 0x20);
        if (((uVar5 >> 0x1d ^
             (uint)((ulong)*(undefined8 *)(pGVar3 + -(ulong)(uVar5 & 0x1fffffff)) >> 0x3e)) & 1) !=
            0) {
          __assert_fail("(Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 0 || (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj)) == 0"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecPat.c"
                        ,0xbd,
                        "void Cec_ManPatComputePattern1_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)")
          ;
        }
        if ((uVar6 & 1) != 0) {
          pObj = pGVar3 + -(ulong)(uVar5 & 0x1fffffff);
        }
      }
    }
    else {
      Cec_ManPatComputePattern1_rec(p,pObj,vPat);
      pObj = pGVar3 + -(ulong)(*(uint *)&pGVar3->field_0x4 & 0x1fffffff);
    }
  }
  return;
}

Assistant:

void Cec_ManPatComputePattern1_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vPat )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vPat, Abc_Var2Lit( Gia_ObjCioId(pObj), pObj->fMark1==0 ) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    if ( pObj->fMark1 == 1 )
    {
        Cec_ManPatComputePattern1_rec( p, Gia_ObjFanin0(pObj), vPat );
        Cec_ManPatComputePattern1_rec( p, Gia_ObjFanin1(pObj), vPat );
    }
    else
    {
        assert( (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 0 ||
                (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj)) == 0 );
        if ( (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 0 )
            Cec_ManPatComputePattern1_rec( p, Gia_ObjFanin0(pObj), vPat );
        else
            Cec_ManPatComputePattern1_rec( p, Gia_ObjFanin1(pObj), vPat );
    }
}